

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)304>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *featureDesc;
  int i;
  int index;
  ModelDescription *pMVar2;
  undefined1 auStack_58 [40];
  
  Result::Result(__return_storage_ptr__);
  pMVar2 = format->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  index = 0;
  do {
    if ((pMVar2->input_).super_RepeatedPtrFieldBase.current_size_ <= index) {
      return __return_storage_ptr__;
    }
    featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&(pMVar2->input_).super_RepeatedPtrFieldBase,index);
    validateSchemaTypesIsMultiArray
              ((Result *)auStack_58,featureDesc,ArrayFeatureType_ArrayDataType_INT32,1,2);
    Result::operator=(__return_storage_ptr__,(Result *)auStack_58);
    std::__cxx11::string::~string((string *)(auStack_58 + 8));
    bVar1 = Result::good(__return_storage_ptr__);
    index = index + 1;
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_bayesianProbitRegressor>(const Specification::Model& format) {
        Result result;
        const auto& description = format.description();
        const auto& inputFeatures = description.input();
        for (int i = 0; i < inputFeatures.size(); i++) {
            const auto& featureDesc = inputFeatures[i];
            result = validateSchemaTypesIsMultiArray(featureDesc, Specification::ArrayFeatureType_ArrayDataType_INT32, 1, 2);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }